

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O0

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::d
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,int component,
          double d0,...)

{
  Scalar SVar1;
  char in_AL;
  Scalar *pSVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  double extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Scalar *local_158;
  Scalar local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uint local_60;
  uint i;
  int local_4c;
  undefined1 local_48 [8];
  vector V;
  va_list vl;
  double d0_local;
  int component_local;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_4c = 3;
  local_118[2] = (Scalar)in_RDX;
  local_118[3] = (Scalar)in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_48,&local_4c);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,0);
  *pSVar2 = d0;
  vl[0]._0_8_ = &stack0x00000008;
  V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0x40;
  V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 0x10;
  for (local_60 = 1; local_60 < 3; local_60 = local_60 + 1) {
    if (V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <
        0xa1) {
      local_158 = (Scalar *)
                  ((long)local_118 +
                  (long)(int)V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows._4_4_);
      V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ +
           0x10;
    }
    else {
      local_158 = (Scalar *)vl[0]._0_8_;
      vl[0]._0_8_ = vl[0]._0_8_ + 8;
    }
    SVar1 = *local_158;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,
                        (ulong)local_60);
    *pSVar2 = SVar1;
  }
  (*(this->super_function)._vptr_function[7])(this,(ulong)(uint)component,local_48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  return extraout_XMM0_Qa;
}

Assistant:

virtual const double d(int component, double d0, ...) const {
            va_list vl;
            vector V(N);
            V[0] = d0;

            va_start(vl, d0);
            for(unsigned int i = 1; i < N; i++) {
                V[i] = va_arg(vl, double);
            }
            va_end(vl);

            return d(component, V);
        }